

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void process_replacement(c2m_ctx_t c2m_ctx,macro_call_t mc)

{
  short sVar1;
  int iVar2;
  macro_t pmVar3;
  VARR_token_t *tokens;
  char obj;
  uint uVar4;
  token_t *pptVar5;
  size_t sVar6;
  token_arr_t varr;
  long lVar7;
  size_t sVar8;
  token_t ptVar9;
  token_t ptVar10;
  node_t_conflict node;
  ulong ix;
  char *pcVar11;
  str_t sVar12;
  size_t local_60;
  int local_58;
  
  pmVar3 = mc->macro;
  pptVar5 = VARR_token_taddr(pmVar3->replacement);
  sVar6 = VARR_token_tlength(pmVar3->replacement);
  local_60 = 0xffffffffffffffff;
  do {
    while( true ) {
      iVar2 = mc->repl_pos;
      local_58 = (int)sVar6;
      if (local_58 <= iVar2) {
        ptVar10 = get_next_pptoken(c2m_ctx);
        unget_next_pptoken(c2m_ctx,ptVar10);
        ptVar10 = new_token(c2m_ctx,ptVar10->pos,"",0x145,N_IGNORE);
        unget_next_pptoken(c2m_ctx,ptVar10);
        tokens = mc->repl_buffer;
        do_concat(c2m_ctx,tokens);
        push_back(c2m_ctx,tokens);
        pmVar3->ignore_p = 1;
        return;
      }
      mc->repl_pos = iVar2 + 1;
      ptVar10 = pptVar5[iVar2];
      sVar1 = *(short *)ptVar10;
      if (sVar1 == 0x103) break;
      if (sVar1 != 0x20) {
        if (sVar1 == 0x23) {
          local_60 = VARR_token_tlength(mc->repl_buffer);
        }
        else {
          local_60 = 0xffffffffffffffff;
        }
      }
LAB_00160f46:
      ptVar10 = copy_token(c2m_ctx,ptVar10,mc->pos);
LAB_00160f5c:
      add_token(mc->repl_buffer,ptVar10);
    }
    uVar4 = find_param(pmVar3->params,ptVar10->repr);
    if ((int)uVar4 < 0) goto LAB_00160f46;
    varr = VARR_token_arr_tget(mc->args,(ulong)uVar4);
    if (-1 < (int)local_60) {
      del_tokens(mc->repl_buffer,(int)local_60,-1);
      sVar8 = VARR_token_tlength(varr);
      if ((sVar8 != 0) &&
         ((ptVar10 = VARR_token_tget(varr,0), *(short *)ptVar10 == 0x20 ||
          (ptVar10 = VARR_token_tget(varr,0), *(short *)ptVar10 == 10)))) {
        del_tokens(varr,0,1);
      }
      sVar8 = VARR_token_tlength(varr);
      if ((sVar8 != 0) &&
         ((ptVar10 = VARR_token_tlast(varr), *(short *)ptVar10 == 0x20 ||
          (ptVar10 = VARR_token_tlast(varr), *(short *)ptVar10 == 10)))) {
        VARR_token_tpop(varr);
      }
      ptVar10 = mc->macro->id;
      sVar8 = VARR_token_tlength(varr);
      if (sVar8 != 0) {
        ptVar10 = VARR_token_tget(varr,0);
      }
      pcVar11 = (c2m_ctx->empty_str).s;
      sVar8 = (c2m_ctx->empty_str).len;
      node = new_pos_node(c2m_ctx,N_STR,ptVar10->pos);
      (node->u).s.s = pcVar11;
      (node->u).s.len = sVar8;
      ptVar10 = new_node_token(c2m_ctx,ptVar10->pos,"",0x102,node);
      VARR_chartrunc(c2m_ctx->temp_string,0);
      pcVar11 = ptVar10->repr;
      while( true ) {
        if (*pcVar11 == '\0') break;
        VARR_charpush(c2m_ctx->temp_string,*pcVar11);
        pcVar11 = pcVar11 + 1;
      }
      VARR_charpush(c2m_ctx->temp_string,'\"');
      ix = 0;
      while (sVar8 = VARR_token_tlength(varr), ix < sVar8) {
        ptVar9 = VARR_token_tget(varr,ix);
        if ((*(short *)ptVar9 == 0x20) ||
           (ptVar9 = VARR_token_tget(varr,ix), *(short *)ptVar9 == 10)) {
          VARR_charpush(c2m_ctx->temp_string,' ');
          ix = ix + 1;
        }
        else {
          ptVar9 = VARR_token_tget(varr,ix);
          ix = ix + 1;
          for (pcVar11 = ptVar9->repr; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
            sVar8 = VARR_token_tlength(varr);
            uVar4 = 0;
            if (sVar8 != ix) {
              ptVar9 = VARR_token_tget(varr,ix);
              uVar4 = (uint)*ptVar9->repr;
            }
            obj = *pcVar11;
            if (obj == '\"') {
LAB_00161163:
              VARR_charpush(c2m_ctx->temp_string,'\\');
              obj = *pcVar11;
            }
            else if (obj == '\\') {
              obj = '\\';
              if (((0x37 < uVar4 - 0x3f) ||
                  ((0xa880cc20000001U >> ((ulong)(uVar4 - 0x3f) & 0x3f) & 1) == 0)) &&
                 ((uVar4 & 0xffffffdf) != 0x58 && (uVar4 & 0xfffffff8) != 0x30)) goto LAB_00161163;
            }
            VARR_charpush(c2m_ctx->temp_string,obj);
          }
        }
      }
      VARR_charpush(c2m_ctx->temp_string,'\"');
      VARR_charpush(c2m_ctx->temp_string,'\0');
      pcVar11 = VARR_charaddr(c2m_ctx->temp_string);
      sVar12 = uniq_cstr(c2m_ctx,pcVar11);
      ptVar10->repr = sVar12.s;
      set_string_val(c2m_ctx,ptVar10,c2m_ctx->temp_string,0x20);
      goto LAB_00160f5c;
    }
    iVar2 = mc->repl_pos;
    lVar7 = (long)iVar2;
    if (((lVar7 < 2) ||
        ((*(short *)pptVar5[lVar7 + -2] != 0x142 &&
         (((iVar2 == 2 || (*(short *)pptVar5[lVar7 + -2] != 0x20)) ||
          (*(short *)pptVar5[lVar7 + -3] != 0x142)))))) &&
       (((local_58 <= iVar2 || (*(short *)pptVar5[lVar7] != 0x142)) &&
        ((local_58 <= iVar2 + 1 ||
         ((*(short *)pptVar5[iVar2 + 1] != 0x142 || (*(short *)pptVar5[lVar7] != 0x20)))))))) {
      ptVar9 = new_token(c2m_ctx,ptVar10->pos,"",0x144,N_IGNORE);
      unget_next_pptoken(c2m_ctx,ptVar9);
      copy_and_push_back(c2m_ctx,varr,mc->pos);
      ptVar10 = new_token(c2m_ctx,ptVar10->pos,"",0x143,N_IGNORE);
      unget_next_pptoken(c2m_ctx,ptVar10);
      return;
    }
    sVar8 = VARR_token_tlength(varr);
    if ((sVar8 == 0) ||
       ((sVar8 = VARR_token_tlength(varr), sVar8 == 1 &&
        ((ptVar9 = VARR_token_tget(varr,0), *(short *)ptVar9 == 0x20 ||
         (ptVar9 = VARR_token_tget(varr,0), *(short *)ptVar9 == 10)))))) {
      ptVar10 = new_token(c2m_ctx,ptVar10->pos,"",0x141,N_IGNORE);
      goto LAB_00160f5c;
    }
    add_tokens(mc->repl_buffer,varr);
  } while( true );
}

Assistant:

static void process_replacement (c2m_ctx_t c2m_ctx, macro_call_t mc) {
  macro_t m;
  token_t t, *m_repl;
  VARR (token_t) * arg;
  int i, m_repl_len, sharp_pos, copy_p;

  m = mc->macro;
  sharp_pos = -1;
  m_repl = VARR_ADDR (token_t, m->replacement);
  m_repl_len = (int) VARR_LENGTH (token_t, m->replacement);
  for (;;) {
    if (mc->repl_pos >= m_repl_len) {
      t = get_next_pptoken (c2m_ctx);
      unget_next_pptoken (c2m_ctx, t);
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <%s>\n", get_token_str (t));
#endif
      unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOR, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <EOR>: mc=%lx\n", mc);
#endif
      push_back (c2m_ctx, do_concat (c2m_ctx, mc->repl_buffer));
      m->ignore_p = TRUE;
      return;
    }
    t = m_repl[mc->repl_pos++];
    copy_p = TRUE;
    if (t->code == T_ID) {
      i = find_param (m->params, t->repr);
      if (i >= 0) {
        arg = VARR_GET (token_arr_t, mc->args, i);
        if (sharp_pos >= 0) {
          del_tokens (mc->repl_buffer, sharp_pos, -1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_GET (token_t, arg, 0)->code == ' '
                  || VARR_GET (token_t, arg, 0)->code == '\n'))
            del_tokens (arg, 0, 1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_LAST (token_t, arg)->code == ' ' || VARR_LAST (token_t, arg)->code == '\n'))
            VARR_POP (token_t, arg);
          t = token_stringify (c2m_ctx, mc->macro->id, arg);
          copy_p = FALSE;
        } else if ((mc->repl_pos >= 2 && m_repl[mc->repl_pos - 2]->code == T_RDBLNO)
                   || (mc->repl_pos >= 3 && m_repl[mc->repl_pos - 2]->code == ' '
                       && m_repl[mc->repl_pos - 3]->code == T_RDBLNO)
                   || (mc->repl_pos < m_repl_len && m_repl[mc->repl_pos]->code == T_RDBLNO)
                   || (mc->repl_pos + 1 < m_repl_len && m_repl[mc->repl_pos + 1]->code == T_RDBLNO
                       && m_repl[mc->repl_pos]->code == ' ')) {
          if (VARR_LENGTH (token_t, arg) == 0
              || (VARR_LENGTH (token_t, arg) == 1
                  && (VARR_GET (token_t, arg, 0)->code == ' '
                      || VARR_GET (token_t, arg, 0)->code == '\n'))) {
            t = new_token (c2m_ctx, t->pos, "", T_PLM, N_IGNORE);
            copy_p = FALSE;
          } else {
            add_tokens (mc->repl_buffer, arg);
            continue;
          }
        } else {
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <EOA> for macro %s call\n", mc->macro->id->repr);
#endif
          copy_and_push_back (c2m_ctx, arg, mc->pos);
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_BOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <BOA> for macro %s call\n", mc->macro->id->repr);
#endif
          return;
        }
      }
    } else if (t->code == '#') {
      sharp_pos = (int) VARR_LENGTH (token_t, mc->repl_buffer);
    } else if (t->code != ' ') {
      sharp_pos = -1;
    }
    if (copy_p) t = copy_token (c2m_ctx, t, mc->pos);
    add_token (mc->repl_buffer, t);
  }
}